

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

void Abc_NtkGenFaultList(Abc_Ntk_t *pNtk,char *pFileName,int fStuckAt)

{
  Mio_Library_t *pLib_00;
  Mio_Gate_t *pGate_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  Abc_Obj_t *pObj_00;
  char *pcVar4;
  char *pcVar5;
  int nInputs;
  Mio_Gate_t *pGateObj;
  FILE *pFile;
  int Count;
  int i;
  Abc_Obj_t *pObj;
  Mio_Gate_t *pGate;
  Mio_Library_t *pLib;
  int fStuckAt_local;
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  pLib_00 = (Mio_Library_t *)pNtk->pManFunc;
  pFile._0_4_ = 1;
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
  }
  else {
    iVar1 = Abc_NtkIsMappedLogic(pNtk);
    if (iVar1 == 0) {
      __assert_fail("Abc_NtkIsMappedLogic(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                    ,0x4e,"void Abc_NtkGenFaultList(Abc_Ntk_t *, char *, int)");
    }
    for (pFile._4_4_ = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), pFile._4_4_ < iVar1;
        pFile._4_4_ = pFile._4_4_ + 1) {
      pObj_00 = Abc_NtkObj(pNtk,pFile._4_4_);
      if ((pObj_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0)) {
        pGate_00 = (Mio_Gate_t *)(pObj_00->field_5).pData;
        iVar1 = Mio_GateReadPinNum(pGate_00);
        pcVar4 = Abc_ObjName(pObj_00);
        fprintf(__stream,"%d %s %s\n",(ulong)(uint)pFile,pcVar4,"SA0");
        pcVar4 = Abc_ObjName(pObj_00);
        fprintf(__stream,"%d %s %s\n",(ulong)((uint)pFile + 1),pcVar4,"SA1");
        pcVar4 = Abc_ObjName(pObj_00);
        fprintf(__stream,"%d %s %s\n",(ulong)((uint)pFile + 2),pcVar4,"NEG");
        pFile._0_4_ = (uint)pFile + 3;
        if (fStuckAt == 0) {
          for (pObj = (Abc_Obj_t *)Mio_LibraryReadGates(pLib_00); pObj != (Abc_Obj_t *)0x0;
              pObj = (Abc_Obj_t *)Mio_GateReadNext((Mio_Gate_t *)pObj)) {
            if (((Mio_Gate_t *)pObj != pGate_00) &&
               (iVar2 = Mio_GateReadPinNum((Mio_Gate_t *)pObj), iVar2 == iVar1)) {
              pcVar4 = Abc_ObjName(pObj_00);
              pcVar5 = Mio_GateReadName((Mio_Gate_t *)pObj);
              fprintf(__stream,"%d %s %s\n",(ulong)(uint)pFile,pcVar4,pcVar5);
              pFile._0_4_ = (uint)pFile + 1;
            }
          }
        }
      }
    }
    pcVar4 = Abc_NtkName(pNtk);
    uVar3 = Abc_NtkNodeNum(pNtk);
    pcVar5 = "";
    if (fStuckAt != 0) {
      pcVar5 = "stuck-at ";
    }
    printf("Generated fault list \"%s\" for network \"%s\" with %d nodes and %d %sfaults.\n",
           pFileName,pcVar4,(ulong)uVar3,(ulong)((uint)pFile - 1),pcVar5);
    fclose(__stream);
  }
  return;
}

Assistant:

void Abc_NtkGenFaultList( Abc_Ntk_t * pNtk, char * pFileName, int fStuckAt )
{
    Mio_Library_t * pLib = (Mio_Library_t *)pNtk->pManFunc;
    Mio_Gate_t * pGate;
    Abc_Obj_t * pObj;
    int i, Count = 1;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return;
    }
    assert( Abc_NtkIsMappedLogic(pNtk) );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        Mio_Gate_t * pGateObj = (Mio_Gate_t *)pObj->pData;
        int nInputs = Mio_GateReadPinNum(pGateObj);
        // add basic faults (SA0, SA1, NEG)
        fprintf( pFile, "%d %s %s\n", Count, Abc_ObjName(pObj), "SA0" ), Count++;
        fprintf( pFile, "%d %s %s\n", Count, Abc_ObjName(pObj), "SA1" ), Count++;
        fprintf( pFile, "%d %s %s\n", Count, Abc_ObjName(pObj), "NEG" ), Count++;
        if ( fStuckAt )
            continue;
        // add other faults, which correspond to changing the given gate
        // by another gate with the same support-size from the same library
        Mio_LibraryForEachGate( pLib, pGate )
            if ( pGate != pGateObj && Mio_GateReadPinNum(pGate) == nInputs )
                fprintf( pFile, "%d %s %s\n", Count, Abc_ObjName(pObj), Mio_GateReadName(pGate) ), Count++;
    }
    printf( "Generated fault list \"%s\" for network \"%s\" with %d nodes and %d %sfaults.\n", 
        pFileName, Abc_NtkName(pNtk), Abc_NtkNodeNum(pNtk), Count-1, fStuckAt ? "stuck-at ":"" );
    fclose( pFile );
}